

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.hh
# Opt level: O3

intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_> __thiscall
tchecker::pool_t<tchecker::make_shared_t<tchecker::vloc_t,unsigned_long,1ul>>::
construct<tchecker::vloc_t_const&>
          (pool_t<tchecker::make_shared_t<tchecker::vloc_t,unsigned_long,1ul>> *this,vloc_t *args)

{
  uint uVar1;
  refcount_t *refcount;
  undefined8 *puVar2;
  uint *in_RDX;
  long lVar3;
  
  puVar2 = (undefined8 *)
           pool_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::allocate
                     ((pool_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_> *)args
                     );
  if (puVar2 == (undefined8 *)0x0) {
    *(undefined8 *)this = 0;
  }
  else {
    uVar1 = *in_RDX;
    *(uint *)(puVar2 + 1) = uVar1;
    if ((ulong)uVar1 != 0) {
      lVar3 = 0;
      do {
        *(undefined4 *)((long)puVar2 + lVar3 + 0xc) = *(undefined4 *)((long)in_RDX + lVar3 + 4);
        lVar3 = lVar3 + 4;
      } while ((ulong)uVar1 << 2 != lVar3);
    }
    *puVar2 = 0;
    *(undefined8 *)this = 0;
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::reset
              ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
                *)this,(make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *)(puVar2 + 1));
  }
  return (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>)
         (make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *)this;
}

Assistant:

tchecker::intrusive_shared_ptr_t<T> construct(ARGS &&... args)
  {
    void * t = allocate();
    if (t == nullptr)
      return tchecker::intrusive_shared_ptr_t<T>(nullptr);
    // p points after the reference counter
    void * p = static_cast<typename T::refcount_t *>(t) + 1;
    try {
      T::construct(p, std::forward<ARGS>(args)...); // construct T in p with args
    }
    catch (...) {
      this->release(t);
      throw;
    }
    return tchecker::intrusive_shared_ptr_t<T>(reinterpret_cast<T *>(p));
  }